

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.c
# Opt level: O3

image_data * tga_read(sptr_t data)

{
  size_t sVar1;
  byte bVar2;
  uint8_t uVar3;
  uint16_t uVar4;
  byte *pbVar5;
  image_data *piVar6;
  ulong uVar7;
  size_t __n;
  ulong uVar8;
  uchar *__s;
  size_t size;
  byte *__src;
  sptr_t sVar9;
  sptr_t colors;
  uchar *ptr;
  uchar *local_38;
  
  pbVar5 = (byte *)xmalloc(0x14);
  local_38 = data.ptr;
  bVar2 = read_8(&local_38);
  *pbVar5 = bVar2;
  bVar2 = read_8(&local_38);
  pbVar5[1] = bVar2;
  bVar2 = read_8(&local_38);
  pbVar5[2] = bVar2;
  uVar4 = read_le16(&local_38);
  *(uint16_t *)(pbVar5 + 4) = uVar4;
  uVar4 = read_le16(&local_38);
  *(uint16_t *)(pbVar5 + 6) = uVar4;
  bVar2 = read_8(&local_38);
  pbVar5[8] = bVar2;
  uVar4 = read_le16(&local_38);
  *(uint16_t *)(pbVar5 + 10) = uVar4;
  uVar4 = read_le16(&local_38);
  *(uint16_t *)(pbVar5 + 0xc) = uVar4;
  uVar4 = read_le16(&local_38);
  *(uint16_t *)(pbVar5 + 0xe) = uVar4;
  uVar4 = read_le16(&local_38);
  *(uint16_t *)(pbVar5 + 0x10) = uVar4;
  bVar2 = read_8(&local_38);
  pbVar5[0x12] = bVar2;
  bVar2 = read_8(&local_38);
  pbVar5[0x13] = bVar2 << 4 | pbVar5[0x13] & 3 | bVar2 >> 2 & 0xc;
  sVar9 = sptr_advance(data,0x12);
  piVar6 = (image_data *)xmalloc(0x50);
  if (pbVar5[1] == 0) {
    size = 0;
  }
  else {
    size = (size_t)((uint)pbVar5[8] * (uint)*(ushort *)(pbVar5 + 6) >> 3);
  }
  piVar6->header = pbVar5;
  piVar6->type = '\x03';
  uVar8 = (ulong)(CONCAT24((short)((uint)*(undefined4 *)(pbVar5 + 0xe) >> 0x10),
                           *(undefined4 *)(pbVar5 + 0xe)) & 0xffff0000ffff);
  piVar6->width = (int)uVar8;
  piVar6->height = (int)(uVar8 >> 0x20);
  (piVar6->palette).data.ptr = (uchar *)0x0;
  (piVar6->palette).data.size = 0;
  (piVar6->palette).type = '\0';
  sVar9 = sptr_advance(sVar9,(ulong)*pbVar5);
  if (pbVar5[1] != 0) {
    colors = sptr_xmalloc(size);
    memcpy(colors.ptr,sVar9.ptr,size);
    uVar3 = 0xff;
    if ((pbVar5[8] == 0x18) && ((int)size == 0x300)) {
      flip_bgr(colors);
      uVar3 = '\x01';
    }
    (piVar6->palette).data = colors;
    (piVar6->palette).type = uVar3;
  }
  sVar9 = sptr_advance(sVar9,size);
  __src = sVar9.ptr;
  (piVar6->pixels).ptr = (uchar *)0x0;
  (piVar6->pixels).size = 0;
  if (pbVar5[2] == 9) {
    if (pbVar5[0x12] == 8) {
      sVar9 = sptr_xmalloc((ulong)(piVar6->height * piVar6->width));
      __s = sVar9.ptr;
      piVar6->pixels = sVar9;
      if (sVar9.size != 0) {
        uVar8 = 0;
        do {
          bVar2 = *__src;
          __n = (ulong)(bVar2 & 0x7f) + 1;
          if ((char)bVar2 < '\0') {
            uVar7 = (ulong)(bVar2 & 0x7f);
            memset(__s,(uint)__src[1],uVar7 + 1);
            sVar1 = uVar7 + 1;
            __src = __src + 2;
          }
          else {
            memcpy(__s,__src + 1,__n);
            __src = __src + 1 + __n;
            sVar1 = __n;
          }
          __s = __s + sVar1;
          uVar8 = (ulong)(uint)((int)uVar8 + (int)__n);
        } while (uVar8 < (piVar6->pixels).size);
      }
    }
  }
  else if ((pbVar5[2] == 1) && (pbVar5[0x12] == 8)) {
    sVar9 = sptr_xmalloc((ulong)(piVar6->height * piVar6->width));
    piVar6->pixels = sVar9;
    memcpy(sVar9.ptr,__src,sVar9.size);
  }
  return piVar6;
}

Assistant:

struct image_data *tga_read(const sptr_t data)
{
	struct tga_header *header = xmalloc(sizeof(struct tga_header));
	sptr_t content = tga_read_header(data, header);
	sptr_t palette;
	size_t cm_size = 0;
	struct image_data *im = xmalloc(sizeof(struct image_data));
	if (header->color_map_type > 0) {
		cm_size = (header->cm_entry_count * header->cm_entry_size) / 8;
	}
	im->header = header;
	im->type = IMAGE_TYPE_TGA;
	im->width = header->im_width;
	im->height = header->im_height;
	im->palette = (struct image_palette){SPTR_NULL, PALETTE_TYPE_NONE};
	// skip image ID
	content = sptr_advance(content, header->id_length);
	// color map
	if (header->color_map_type > 0) {
		palette = sptr_xmalloc(cm_size);
		memcpy(palette.ptr, content.ptr, cm_size);
		if (header->cm_entry_size == 24 && cm_size == 3 * 256) {
			flip_bgr(palette);
			im->palette = (struct image_palette){palette, PALETTE_TYPE_RGB_256};
		} else {
			im->palette = (struct image_palette){palette, PALETTE_TYPE_UNKNOWN};
		}
	}
	content = sptr_advance(content, cm_size);
	// pixels
	im->pixels = SPTR_NULL;
	if ((header->image_type == TGA_IMAGE_TYPE_UNCOMPRESSED_COLOR_MAPPED) &&
		(header->im_pixel_depth == 8)) {
		im->pixels = sptr_xmalloc(im->width * im->height);
		memcpy(im->pixels.ptr, content.ptr, im->pixels.size);
	} else if ((header->image_type == TGA_IMAGE_TYPE_RLE_COLOR_MAPPED) &&
			   (header->im_pixel_depth == 8)) {
		tga_read_rle_indexed(im, content);
	}
	return im;
}